

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O1

Promise<void> __thiscall kj::anon_unknown_31::HttpOutputStream::flush(HttpOutputStream *this)

{
  undefined8 *puVar1;
  long *plVar2;
  PromiseNode *pPVar3;
  PromiseNode *pPVar4;
  PromiseNode *extraout_RDX;
  long in_RSI;
  Promise<void> PVar5;
  ForkedPromise<void> fork;
  undefined1 local_38 [8];
  long *local_30;
  Promise<void> local_28;
  
  Promise<void>::fork(&local_28);
  PVar5 = _::ForkHub<kj::_::Void>::addBranch((ForkHub<kj::_::Void> *)local_38);
  puVar1 = *(undefined8 **)(in_RSI + 8);
  plVar2 = *(long **)(in_RSI + 0x10);
  *(undefined1 (*) [8])(in_RSI + 8) = local_38;
  *(long **)(in_RSI + 0x10) = local_30;
  local_30 = (long *)0x0;
  if (plVar2 != (long *)0x0) {
    (**(code **)*puVar1)
              (puVar1,(long)plVar2 + *(long *)(*plVar2 + -0x10),PVar5.super_PromiseBase.node.ptr);
  }
  plVar2 = local_30;
  if (local_30 != (long *)0x0) {
    local_30 = (long *)0x0;
    (**(code **)*(_func_int **)local_38)(local_38,(long)plVar2 + *(long *)(*plVar2 + -0x10));
  }
  PVar5 = _::ForkHub<kj::_::Void>::addBranch((ForkHub<kj::_::Void> *)this);
  pPVar3 = local_28.super_PromiseBase.node.ptr;
  pPVar4 = PVar5.super_PromiseBase.node.ptr;
  if ((EventLoop *)local_28.super_PromiseBase.node.ptr != (EventLoop *)0x0) {
    local_28.super_PromiseBase.node.ptr = (PromiseNode *)0x0;
    (**(local_28.super_PromiseBase.node.disposer)->_vptr_Disposer)
              (local_28.super_PromiseBase.node.disposer,
               (long)&pPVar3->_vptr_PromiseNode +
               (long)((EventPort *)pPVar3->_vptr_PromiseNode)[-2]._vptr_EventPort);
    pPVar4 = extraout_RDX;
  }
  PVar5.super_PromiseBase.node.ptr = pPVar4;
  PVar5.super_PromiseBase.node.disposer = (Disposer *)this;
  return (Promise<void>)PVar5.super_PromiseBase.node;
}

Assistant:

kj::Promise<void> flush() {
    auto fork = writeQueue.fork();
    writeQueue = fork.addBranch();
    return fork.addBranch();
  }